

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O0

void __thiscall
DivideTest<int>::test_vectordivide_numerators<(libdivide::Branching)1>
          (DivideTest<int> *this,int denom,divider<int,_(libdivide::Branching)1> *the_divider)

{
  int iVar1;
  int *in_RDX;
  undefined4 in_ESI;
  DivideTest<int> *in_RDI;
  size_t j;
  size_t i;
  int *numers;
  size_t offset;
  char mem [128];
  ulong local_b8;
  ulong local_b0;
  undefined1 local_98 [64];
  int aiStack_58 [10];
  divider<int,_(libdivide::Branching)1> *in_stack_ffffffffffffffd0;
  int in_stack_ffffffffffffffdc;
  size_t in_stack_ffffffffffffffe0;
  undefined4 in_stack_fffffffffffffff0;
  
  for (local_b0 = 0; local_b0 < 10000; local_b0 = local_b0 + 1) {
    for (local_b8 = 0; local_b8 < 0x10; local_b8 = local_b8 + 1) {
      iVar1 = get_random(in_RDI);
      *(int *)((long)aiStack_58 + (local_b8 * 4 - ((ulong)local_98 & 0x3f))) = iVar1;
    }
    test_vec<long_long__vector(2),(libdivide::Branching)1>
              ((DivideTest<int> *)CONCAT44(in_ESI,in_stack_fffffffffffffff0),in_RDX,
               in_stack_ffffffffffffffe0,in_stack_ffffffffffffffdc,in_stack_ffffffffffffffd0);
    test_vec<long_long__vector(4),(libdivide::Branching)1>
              ((DivideTest<int> *)mem._16_8_,(int *)mem._8_8_,mem._0_8_,offset._4_4_,
               (divider<int,_(libdivide::Branching)1> *)numers);
    test_vec<long_long__vector(8),(libdivide::Branching)1>
              ((DivideTest<int> *)mem._112_8_,(int *)mem._104_8_,mem._96_8_,mem._92_4_,
               (divider<int,_(libdivide::Branching)1> *)mem._80_8_);
  }
  return;
}

Assistant:

void test_vectordivide_numerators(T denom, const divider<T, ALGO> &the_divider) {
#if defined(VECTOR_TESTS)
        // Align memory to 64 byte boundary for AVX512
        char mem[min_vector_count * sizeof(T) + 64];
        size_t offset = 64 - (size_t)&mem % 64;
        T *numers = (T *)&mem[offset];

        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                numers[j] = get_random();
            }
#ifdef LIBDIVIDE_SSE2
            test_vec<__m128i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX2
            test_vec<__m256i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_AVX512
            test_vec<__m512i>(numers, min_vector_count, denom, the_divider);
#endif
#ifdef LIBDIVIDE_NEON
            test_vec<typename NeonVecFor<T>::type>(numers, min_vector_count, denom, the_divider);
#endif
        }
#else
        UNUSED(denom);
        UNUSED(the_divider);
#endif
    }